

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::StartScheduledTasks
          (PeerManagerImpl *this,CScheduler *scheduler)

{
  long lVar1;
  minutes f;
  type delta_00;
  function<void_()> *in_RSI;
  CScheduler *in_RDI;
  long in_FS_OFFSET;
  type delta;
  FastRandomContext *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  FastRandomContext *in_stack_fffffffffffffe88;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> in_stack_fffffffffffffe90;
  CScheduler *in_stack_fffffffffffffe98;
  milliseconds in_stack_fffffffffffffef8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<void()>::
  function<(anonymous_namespace)::PeerManagerImpl::StartScheduledTasks(CScheduler&)::__0,void>
            ((function<void_()> *)in_stack_fffffffffffffe88,
             (anon_class_8_1_8991fb9c *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe78);
  CScheduler::scheduleEvery
            (in_stack_fffffffffffffe98,(Function *)in_stack_fffffffffffffe90.__r,
             in_stack_fffffffffffffef8);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffe78);
  min<(char)49,(char)48>();
  FastRandomContext::FastRandomContext(in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87);
  f = min<(char)53>();
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffe78);
  RandomMixin<FastRandomContext>::randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
            ((RandomMixin<FastRandomContext> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),in_stack_fffffffffffffe90
            );
  delta_00 = std::chrono::operator+
                       ((duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90.__r);
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffe78);
  std::function<void()>::
  function<(anonymous_namespace)::PeerManagerImpl::StartScheduledTasks(CScheduler&)::__1,void>
            (in_RSI,(anon_class_16_2_5bd75528 *)
                    CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  CScheduler::scheduleFromNow(in_RDI,(Function *)f.__r,(milliseconds)delta_00.__r);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::StartScheduledTasks(CScheduler& scheduler)
{
    // Stale tip checking and peer eviction are on two different timers, but we
    // don't want them to get out of sync due to drift in the scheduler, so we
    // combine them in one function and schedule at the quicker (peer-eviction)
    // timer.
    static_assert(EXTRA_PEER_CHECK_INTERVAL < STALE_CHECK_INTERVAL, "peer eviction timer should be less than stale tip check timer");
    scheduler.scheduleEvery([this] { this->CheckForStaleTipAndEvictPeers(); }, std::chrono::seconds{EXTRA_PEER_CHECK_INTERVAL});

    // schedule next run for 10-15 minutes in the future
    const auto delta = 10min + FastRandomContext().randrange<std::chrono::milliseconds>(5min);
    scheduler.scheduleFromNow([&] { ReattemptInitialBroadcast(scheduler); }, delta);
}